

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O0

void Hop_ObjCollectMulti_rec(Hop_Obj_t *pRoot,Hop_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  int iVar1;
  Hop_Type_t HVar2;
  Hop_Type_t HVar3;
  Hop_Obj_t *pHVar4;
  Vec_Ptr_t *vSuper_local;
  Hop_Obj_t *pObj_local;
  Hop_Obj_t *pRoot_local;
  
  if (pRoot == pObj) {
LAB_00a3efb7:
    pHVar4 = Hop_ObjChild0(pObj);
    Hop_ObjCollectMulti_rec(pRoot,pHVar4,vSuper);
    pHVar4 = Hop_ObjChild1(pObj);
    Hop_ObjCollectMulti_rec(pRoot,pHVar4,vSuper);
  }
  else {
    iVar1 = Hop_IsComplement(pObj);
    if (iVar1 == 0) {
      iVar1 = Hop_ObjIsPi(pObj);
      if (iVar1 == 0) {
        HVar2 = Hop_ObjType(pRoot);
        HVar3 = Hop_ObjType(pObj);
        if (HVar2 == HVar3) goto LAB_00a3efb7;
      }
    }
    Vec_PtrPushUnique(vSuper,pObj);
  }
  return;
}

Assistant:

void Hop_ObjCollectMulti_rec( Hop_Obj_t * pRoot, Hop_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( pRoot != pObj && (Hop_IsComplement(pObj) || Hop_ObjIsPi(pObj) || Hop_ObjType(pRoot) != Hop_ObjType(pObj)) )
    {
        Vec_PtrPushUnique(vSuper, pObj);
        return;
    }
    Hop_ObjCollectMulti_rec( pRoot, Hop_ObjChild0(pObj), vSuper );
    Hop_ObjCollectMulti_rec( pRoot, Hop_ObjChild1(pObj), vSuper );
}